

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

string * __thiscall
cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_
          (string *__return_storage_ptr__,AddressFormatData *this)

{
  bool bVar1;
  allocator local_89;
  string local_88;
  allocator local_61;
  _Self local_60 [3];
  allocator local_41;
  key_type local_40;
  _Self local_20;
  AddressFormatData *local_18;
  AddressFormatData *this_local;
  
  local_18 = this;
  this_local = (AddressFormatData *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"bech32",&local_41);
  local_20._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->map_,&local_40);
  local_60[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->map_);
  bVar1 = ::std::operator==(&local_20,local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_61);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_88,"bech32",&local_89);
    GetString(__return_storage_ptr__,this,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddressFormatData::GetBech32Hrp() const {
  if (map_.find(kPrefixBech32Hrp) == map_.end()) {
    return "";
  }
  return GetString(kPrefixBech32Hrp);
}